

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaTabBar::contextMenuEvent(QMdiAreaTabBar *this,QContextMenuEvent *event)

{
  long lVar1;
  bool bVar2;
  QMdiSubWindowPrivate *pQVar3;
  QWidget *this_00;
  QContextMenuEvent *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *currentSubWindow;
  QMdiSubWindowPrivate *subWindowPrivate;
  QPointer<QMdiSubWindow> subWindow;
  QTabBar *in_stack_ffffffffffffffa8;
  QPointer<QMdiSubWindow> *in_stack_ffffffffffffffb0;
  QPoint *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QMenu *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QMenu *)&DAT_aaaaaaaaaaaaaaaa;
  QContextMenuEvent::pos(in_RSI);
  QTabBar::tabAt((QTabBar *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
  subWindowFromIndex((QMdiAreaTabBar *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  QPointer<QMdiSubWindow>::QPointer<void>
            (in_stack_ffffffffffffffb0,(QMdiSubWindow *)in_stack_ffffffffffffffa8);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x60dcac);
  if (bVar2) {
    QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x60dcbc);
    bVar2 = QWidget::isHidden((QWidget *)0x60dcc4);
    if (!bVar2) {
      QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x60dceb);
      pQVar3 = QMdiSubWindow::d_func((QMdiSubWindow *)0x60dcf3);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x60dd09);
      if (bVar2) {
        QTabBar::currentIndex(in_stack_ffffffffffffffa8);
        this_00 = &subWindowFromIndex((QMdiAreaTabBar *)in_RDI,(int)((ulong)in_RSI >> 0x20))->
                   super_QWidget;
        bVar2 = QWidget::isMaximized(this_00);
        if (bVar2) {
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
          QMdiSubWindowPrivate::setVisible
                    ((QMdiSubWindowPrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (WindowStateAction)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
        }
        pQVar3 = (QMdiSubWindowPrivate *)QPointer<QMenu>::operator->((QPointer<QMenu> *)0x60ddc3);
        QContextMenuEvent::globalPos(in_RSI);
        QMenu::exec(this_01,in_RDI,(QAction *)in_RSI);
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x60dded);
        if (bVar2) {
          QMdiSubWindowPrivate::updateActions(pQVar3);
        }
      }
      else {
        QEvent::ignore((QEvent *)in_RSI);
      }
      goto LAB_0060de0d;
    }
  }
  QEvent::ignore((QEvent *)in_RSI);
LAB_0060de0d:
  QPointer<QMdiSubWindow>::~QPointer((QPointer<QMdiSubWindow> *)0x60de17);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaTabBar::contextMenuEvent(QContextMenuEvent *event)
{
    QPointer<QMdiSubWindow> subWindow = subWindowFromIndex(tabAt(event->pos()));
    if (!subWindow || subWindow->isHidden()) {
        event->ignore();
        return;
    }

#if QT_CONFIG(menu)
    QMdiSubWindowPrivate *subWindowPrivate = subWindow->d_func();
    if (!subWindowPrivate->systemMenu) {
        event->ignore();
        return;
    }

    QMdiSubWindow *currentSubWindow = subWindowFromIndex(currentIndex());
    Q_ASSERT(currentSubWindow);

    // We don't want these actions to show up in the system menu when the
    // current sub-window is maximized, i.e. covers the entire viewport.
    if (currentSubWindow->isMaximized()) {
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MoveAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::ResizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MinimizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::MaximizeAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::RestoreAction, false);
        subWindowPrivate->setVisible(QMdiSubWindowPrivate::StayOnTopAction, false);
    }

    // Show system menu.
    subWindowPrivate->systemMenu->exec(event->globalPos());
    if (!subWindow)
        return;

    // Restore action visibility.
    subWindowPrivate->updateActions();
#endif // QT_CONFIG(menu)
}